

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O3

Image * Test_Helper::uniformImage
                  (Image *__return_storage_ptr__,uint8_t value,uint32_t width,uint32_t height,
                  Image *reference)

{
  uint uVar1;
  
  if (width == 0) {
    uVar1 = rand();
    width = (uVar1 & 0x7ff) + (uint)((uVar1 & 0x7ff) == 0);
  }
  if (height == 0) {
    uVar1 = rand();
    height = (uVar1 & 0x7ff) + (uint)((uVar1 & 0x7ff) == 0);
  }
  anon_unknown.dwarf_149b30::generateImage
            (__return_storage_ptr__,width,height,'\x01',value,reference);
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image uniformImage( uint8_t value, uint32_t width, uint32_t height, const PenguinV_Image::Image & reference )
    {
        return generateImage( (width > 0u) ? width : randomSize(), (height > 0u) ? height : randomSize(), PenguinV_Image::GRAY_SCALE, value, reference );
    }